

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O2

int header_odc(archive_read *a,cpio *cpio,archive_entry *entry,size_t *namelength,size_t *name_pad)

{
  int iVar1;
  char *p;
  long lVar2;
  void *pvVar3;
  dev_t dVar4;
  int64_t iVar5;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  char *len;
  ulong uVar9;
  int64_t iStack_70;
  size_t local_38;
  
  (a->archive).archive_format = 0x10001;
  (a->archive).archive_format_name = "POSIX octet-oriented cpio";
  lVar2 = 0;
  while( true ) {
    p = (char *)__archive_read_ahead(a,0x4c,(ssize_t *)&local_38);
    sVar6 = local_38;
    if (p == (char *)0x0) {
      return -0x1e;
    }
    pcVar8 = p;
    iVar1 = bcmp("070707",p,6);
    if ((iVar1 == 0) && (iVar1 = is_octal(p,(size_t)pcVar8), iVar1 != 0)) break;
    iVar1 = bcmp("070727",p,6);
    if ((iVar1 == 0) && (iVar1 = is_afio_large(p,sVar6), iVar1 != 0)) {
      iVar1 = 0;
      goto LAB_0045b071;
    }
    for (pcVar8 = p; pcVar8 + 0x4c <= p + sVar6; pcVar8 = pcVar8 + lVar7) {
      lVar7 = 1;
      if (((pcVar8[5] != '0') && (lVar7 = 6, pcVar8[5] == '7')) &&
         (((len = pcVar8, iVar1 = bcmp("070707",pcVar8,6), iVar1 == 0 &&
           (iVar1 = is_octal(pcVar8,(size_t)len), iVar1 != 0)) ||
          ((iVar1 = bcmp("070727",pcVar8,6), lVar7 = 2, iVar1 == 0 &&
           (iVar1 = is_afio_large(pcVar8,(long)(p + sVar6) - (long)pcVar8), iVar1 != 0)))))) {
        __archive_read_consume(a,(long)pcVar8 - (long)p);
        uVar9 = ((long)pcVar8 - (long)p) + lVar2;
        if (pcVar8[4] == '2') {
          (a->archive).archive_format = 0x10006;
        }
        if (uVar9 == 0) {
          iVar1 = 0;
        }
        else {
          archive_set_error(&a->archive,0,"Skipped %d bytes before finding valid header",
                            uVar9 & 0xffffffff);
          iVar1 = -0x14;
        }
        goto LAB_0045b062;
      }
    }
    __archive_read_consume(a,(long)pcVar8 - (long)p);
    lVar2 = lVar2 + ((long)pcVar8 - (long)p);
  }
  iVar1 = 0;
LAB_0045b062:
  if ((a->archive).archive_format != 0x10006) {
    pvVar3 = __archive_read_ahead(a,0x4c,(ssize_t *)0x0);
    if (pvVar3 == (void *)0x0) {
      return -0x1e;
    }
    dVar4 = atol8((char *)((long)pvVar3 + 6),6);
    archive_entry_set_dev(entry,dVar4);
    iVar5 = atol8((char *)((long)pvVar3 + 0xc),6);
    archive_entry_set_ino(entry,iVar5);
    iVar5 = atol8((char *)((long)pvVar3 + 0x12),6);
    archive_entry_set_mode(entry,(mode_t)iVar5);
    iVar5 = atol8((char *)((long)pvVar3 + 0x18),6);
    archive_entry_set_uid(entry,iVar5);
    iVar5 = atol8((char *)((long)pvVar3 + 0x1e),6);
    archive_entry_set_gid(entry,iVar5);
    iVar5 = atol8((char *)((long)pvVar3 + 0x24),6);
    archive_entry_set_nlink(entry,(uint)iVar5);
    dVar4 = atol8((char *)((long)pvVar3 + 0x2a),6);
    archive_entry_set_rdev(entry,dVar4);
    iVar5 = atol8((char *)((long)pvVar3 + 0x30),0xb);
    archive_entry_set_mtime(entry,iVar5,0);
    sVar6 = atol8((char *)((long)pvVar3 + 0x3b),6);
    *namelength = sVar6;
    *name_pad = 0;
    iVar5 = atol8((char *)((long)pvVar3 + 0x41),0xb);
    cpio->entry_bytes_remaining = iVar5;
    archive_entry_set_size(entry,iVar5);
    cpio->entry_padding = 0;
    iStack_70 = 0x4c;
    goto LAB_0045b2cc;
  }
LAB_0045b071:
  (a->archive).archive_format = 0x10006;
  (a->archive).archive_format_name = "afio large ASCII";
  pvVar3 = __archive_read_ahead(a,0x74,(ssize_t *)0x0);
  if (pvVar3 == (void *)0x0) {
    return -0x1e;
  }
  dVar4 = atol16((char *)((long)pvVar3 + 6),8);
  archive_entry_set_dev(entry,dVar4);
  iVar5 = atol16((char *)((long)pvVar3 + 0xe),0x10);
  archive_entry_set_ino(entry,iVar5);
  iVar5 = atol8((char *)((long)pvVar3 + 0x1f),6);
  archive_entry_set_mode(entry,(mode_t)iVar5);
  iVar5 = atol16((char *)((long)pvVar3 + 0x25),8);
  archive_entry_set_uid(entry,iVar5);
  iVar5 = atol16((char *)((long)pvVar3 + 0x2d),8);
  archive_entry_set_gid(entry,iVar5);
  iVar5 = atol16((char *)((long)pvVar3 + 0x35),8);
  archive_entry_set_nlink(entry,(uint)iVar5);
  dVar4 = atol16((char *)((long)pvVar3 + 0x3d),8);
  archive_entry_set_rdev(entry,dVar4);
  iVar5 = atol16((char *)((long)pvVar3 + 0x45),0x10);
  archive_entry_set_mtime(entry,iVar5,0);
  sVar6 = atol16((char *)((long)pvVar3 + 0x56),4);
  *namelength = sVar6;
  *name_pad = 0;
  iVar5 = atol16((char *)((long)pvVar3 + 99),0x10);
  cpio->entry_bytes_remaining = iVar5;
  archive_entry_set_size(entry,iVar5);
  cpio->entry_padding = 0;
  iStack_70 = 0x74;
LAB_0045b2cc:
  __archive_read_consume(a,iStack_70);
  return iVar1;
}

Assistant:

static int
header_odc(struct archive_read *a, struct cpio *cpio,
    struct archive_entry *entry, size_t *namelength, size_t *name_pad)
{
	const void *h;
	int r;
	const char *header;

	a->archive.archive_format = ARCHIVE_FORMAT_CPIO_POSIX;
	a->archive.archive_format_name = "POSIX octet-oriented cpio";

	/* Find the start of the next header. */
	r = find_odc_header(a);
	if (r < ARCHIVE_WARN)
		return (r);

	if (a->archive.archive_format == ARCHIVE_FORMAT_CPIO_AFIO_LARGE) {
		int r2 = (header_afiol(a, cpio, entry, namelength, name_pad));
		if (r2 == ARCHIVE_OK)
			return (r);
		else
			return (r2);
	}

	/* Read fixed-size portion of header. */
	h = __archive_read_ahead(a, odc_header_size, NULL);
	if (h == NULL)
	    return (ARCHIVE_FATAL);

	/* Parse out octal fields. */
	header = (const char *)h;

	archive_entry_set_dev(entry, 
		(dev_t)atol8(header + odc_dev_offset, odc_dev_size));
	archive_entry_set_ino(entry, atol8(header + odc_ino_offset, odc_ino_size));
	archive_entry_set_mode(entry, 
		(mode_t)atol8(header + odc_mode_offset, odc_mode_size));
	archive_entry_set_uid(entry, atol8(header + odc_uid_offset, odc_uid_size));
	archive_entry_set_gid(entry, atol8(header + odc_gid_offset, odc_gid_size));
	archive_entry_set_nlink(entry, 
		(unsigned int)atol8(header + odc_nlink_offset, odc_nlink_size));
	archive_entry_set_rdev(entry,
		(dev_t)atol8(header + odc_rdev_offset, odc_rdev_size));
	archive_entry_set_mtime(entry, atol8(header + odc_mtime_offset, odc_mtime_size), 0);
	*namelength = (size_t)atol8(header + odc_namesize_offset, odc_namesize_size);
	*name_pad = 0; /* No padding of filename. */

	/*
	 * Note: entry_bytes_remaining is at least 64 bits and
	 * therefore guaranteed to be big enough for a 33-bit file
	 * size.
	 */
	cpio->entry_bytes_remaining =
	    atol8(header + odc_filesize_offset, odc_filesize_size);
	archive_entry_set_size(entry, cpio->entry_bytes_remaining);
	cpio->entry_padding = 0;
	__archive_read_consume(a, odc_header_size);
	return (r);
}